

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_queue.h
# Opt level: O2

bool __thiscall
density::
function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
::try_consume_impl(function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *this)

{
  ControlBlock *pCVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *pFVar2;
  void *pvVar3;
  consume_operation cons;
  consume_operation local_28;
  
  pCVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&this->m_queue);
  local_28.m_queue = &this->m_queue;
  local_28.m_control = pCVar1;
  if (pCVar1 != (ControlBlock *)0x0) {
    pFVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::complete_type(&local_28);
    pvVar3 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::unaligned_element_ptr(&local_28);
    (*pFVar2->m_align_invoke_destroy)(pvVar3);
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::consume_operation::commit_nodestroy(&local_28);
  }
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation(&local_28);
  return pCVar1 != (ControlBlock *)0x0;
}

Assistant:

bool try_consume_impl(std::true_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return true;
            }
            else
            {
                return false;
            }
        }